

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<Eigen::Matrix<long,_1,1,0,_1,1>,void>
               (Matrix<long,__1,_1,_0,__1,_1> *container,ostream *os)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long *value;
  
  std::operator<<(os,'{');
  value = (container->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  uVar1 = (container->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  lVar3 = uVar1 * 8;
  lVar2 = 0;
  do {
    if (lVar3 == 0) {
      if ((uVar1 & 0x1fffffffffffffff) != 0) {
LAB_00119880:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_00119880;
    }
    std::operator<<(os,' ');
    ((void)((*{parm#2})<<{parm#1}))testing::internal::
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::PrintValue<long,void>
              (value,os);
    lVar2 = lVar2 + 1;
    value = value + 1;
    lVar3 = lVar3 + -8;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }